

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

bool __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::FindEntry
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char **a_pData,
          char **a_pSection,char **a_pKey,char **a_pVal,char **a_pComment)

{
  char *pcVar1;
  bool bVar2;
  bool local_63;
  byte local_62;
  bool local_61;
  bool local_60;
  byte local_5f;
  byte local_5e;
  byte local_5d;
  bool local_5c;
  byte local_5b;
  bool local_5a;
  bool local_59;
  char *pTagName;
  char *pTrail;
  char **a_pComment_local;
  char **a_pVal_local;
  char **a_pKey_local;
  char **a_pSection_local;
  char **a_pData_local;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this_local;
  
  *a_pComment = (char *)0x0;
  while( true ) {
    if (**a_pData == '\0') {
      return false;
    }
    while( true ) {
      local_59 = false;
      if (**a_pData != '\0') {
        local_59 = IsSpace(this,**a_pData);
      }
      if (local_59 == false) break;
      *a_pData = *a_pData + 1;
    }
    if (**a_pData == '\0') break;
    bVar2 = IsComment(this,**a_pData);
    if (bVar2) {
      LoadMultiLineText(this,a_pData,a_pComment,(char *)0x0,true);
    }
    else if (**a_pData == '[') {
      *a_pData = *a_pData + 1;
      while( true ) {
        local_5a = false;
        if (**a_pData != '\0') {
          local_5a = IsSpace(this,**a_pData);
        }
        if (local_5a == false) break;
        *a_pData = *a_pData + 1;
      }
      *a_pSection = *a_pData;
      while( true ) {
        local_5b = 0;
        if ((**a_pData != '\0') && (local_5b = 0, **a_pData != ']')) {
          bVar2 = IsNewLineChar(this,**a_pData);
          local_5b = bVar2 ^ 0xff;
        }
        if ((local_5b & 1) == 0) break;
        *a_pData = *a_pData + 1;
      }
      if (**a_pData == ']') {
        pTagName = *a_pData;
        do {
          pcVar1 = pTagName;
          pTagName = pcVar1 + -1;
          local_5c = false;
          if (*a_pSection <= pTagName) {
            local_5c = IsSpace(this,*pTagName);
          }
        } while (local_5c != false);
        *pcVar1 = '\0';
        *a_pData = *a_pData + 1;
        while( true ) {
          local_5d = 0;
          if (**a_pData != '\0') {
            bVar2 = IsNewLineChar(this,**a_pData);
            local_5d = bVar2 ^ 0xff;
          }
          if ((local_5d & 1) == 0) break;
          *a_pData = *a_pData + 1;
        }
        *a_pKey = (char *)0x0;
        *a_pVal = (char *)0x0;
        return true;
      }
    }
    else {
      *a_pKey = *a_pData;
      while( true ) {
        local_5e = 0;
        if ((**a_pData != '\0') && (local_5e = 0, **a_pData != '=')) {
          bVar2 = IsNewLineChar(this,**a_pData);
          local_5e = bVar2 ^ 0xff;
        }
        if ((local_5e & 1) == 0) break;
        *a_pData = *a_pData + 1;
      }
      if (**a_pData == '=') {
        if (*a_pKey != *a_pData) {
          pTagName = *a_pData;
          do {
            pcVar1 = pTagName;
            pTagName = pcVar1 + -1;
            local_60 = false;
            if (*a_pKey <= pTagName) {
              local_60 = IsSpace(this,*pTagName);
            }
          } while (local_60 != false);
          *pcVar1 = '\0';
          *a_pData = *a_pData + 1;
          while( true ) {
            local_61 = false;
            if (**a_pData != '\0') {
              bVar2 = IsNewLineChar(this,**a_pData);
              local_61 = false;
              if (!bVar2) {
                local_61 = IsSpace(this,**a_pData);
              }
            }
            if (local_61 == false) break;
            *a_pData = *a_pData + 1;
          }
          *a_pVal = *a_pData;
          while( true ) {
            local_62 = 0;
            if (**a_pData != '\0') {
              bVar2 = IsNewLineChar(this,**a_pData);
              local_62 = bVar2 ^ 0xff;
            }
            if ((local_62 & 1) == 0) break;
            *a_pData = *a_pData + 1;
          }
          pTagName = *a_pData;
          if (**a_pData != '\0') {
            SkipNewLine(this,a_pData);
          }
          do {
            pcVar1 = pTagName;
            pTagName = pcVar1 + -1;
            local_63 = false;
            if (*a_pVal <= pTagName) {
              local_63 = IsSpace(this,*pTagName);
            }
          } while (local_63 != false);
          *pcVar1 = '\0';
          if (((this->m_bAllowMultiLine & 1U) != 0) && (bVar2 = IsMultiLineTag(this,*a_pVal), bVar2)
             ) {
            bVar2 = LoadMultiLineText(this,a_pData,a_pVal,*a_pVal + 3,false);
            return bVar2;
          }
          return true;
        }
        while( true ) {
          local_5f = 0;
          if (**a_pData != '\0') {
            bVar2 = IsNewLineChar(this,**a_pData);
            local_5f = bVar2 ^ 0xff;
          }
          if ((local_5f & 1) == 0) break;
          *a_pData = *a_pData + 1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool
CSimpleIniTempl<SI_CHAR,SI_STRLESS,SI_CONVERTER>::FindEntry(
    SI_CHAR *&        a_pData,
    const SI_CHAR *&  a_pSection,
    const SI_CHAR *&  a_pKey,
    const SI_CHAR *&  a_pVal,
    const SI_CHAR *&  a_pComment
    ) const
{
    a_pComment = NULL;

    SI_CHAR * pTrail = NULL;
    while (*a_pData) {
        // skip spaces and empty lines
        while (*a_pData && IsSpace(*a_pData)) {
            ++a_pData;
        }
        if (!*a_pData) {
            break;
        }

        // skip processing of comment lines but keep a pointer to
        // the start of the comment.
        if (IsComment(*a_pData)) {
            LoadMultiLineText(a_pData, a_pComment, NULL, true);
            continue;
        }

        // process section names
        if (*a_pData == '[') {
            // skip leading spaces
            ++a_pData;
            while (*a_pData && IsSpace(*a_pData)) {
                ++a_pData;
            }

            // find the end of the section name (it may contain spaces)
            // and convert it to lowercase as necessary
            a_pSection = a_pData;
            while (*a_pData && *a_pData != ']' && !IsNewLineChar(*a_pData)) {
                ++a_pData;
            }

            // if it's an invalid line, just skip it
            if (*a_pData != ']') {
                continue;
            }

            // remove trailing spaces from the section
            pTrail = a_pData - 1;
            while (pTrail >= a_pSection && IsSpace(*pTrail)) {
                --pTrail;
            }
            ++pTrail;
            *pTrail = 0;

            // skip to the end of the line
            ++a_pData;  // safe as checked that it == ']' above
            while (*a_pData && !IsNewLineChar(*a_pData)) {
                ++a_pData;
            }

            a_pKey = NULL;
            a_pVal = NULL;
            return true;
        }

        // find the end of the key name (it may contain spaces)
        // and convert it to lowercase as necessary
        a_pKey = a_pData;
        while (*a_pData && *a_pData != '=' && !IsNewLineChar(*a_pData)) {
            ++a_pData;
        }

        // if it's an invalid line, just skip it
        if (*a_pData != '=') {
            continue;
        }

        // empty keys are invalid
        if (a_pKey == a_pData) {
            while (*a_pData && !IsNewLineChar(*a_pData)) {
                ++a_pData;
            }
            continue;
        }

        // remove trailing spaces from the key
        pTrail = a_pData - 1;
        while (pTrail >= a_pKey && IsSpace(*pTrail)) {
            --pTrail;
        }
        ++pTrail;
        *pTrail = 0;

        // skip leading whitespace on the value
        ++a_pData;  // safe as checked that it == '=' above
        while (*a_pData && !IsNewLineChar(*a_pData) && IsSpace(*a_pData)) {
            ++a_pData;
        }

        // find the end of the value which is the end of this line
        a_pVal = a_pData;
        while (*a_pData && !IsNewLineChar(*a_pData)) {
            ++a_pData;
        }

        // remove trailing spaces from the value
        pTrail = a_pData - 1;
        if (*a_pData) { // prepare for the next round
            SkipNewLine(a_pData);
        }
        while (pTrail >= a_pVal && IsSpace(*pTrail)) {
            --pTrail;
        }
        ++pTrail;
        *pTrail = 0;

        // check for multi-line entries
        if (m_bAllowMultiLine && IsMultiLineTag(a_pVal)) {
            // skip the "<<<" to get the tag that will end the multiline
            const SI_CHAR * pTagName = a_pVal + 3;
            return LoadMultiLineText(a_pData, a_pVal, pTagName);
        }

        // return the standard entry
        return true;
    }

    return false;
}